

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O3

string * __thiscall
spirv_cross::
join<char_const(&)[7],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [7],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,char (*ts_2) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4,char (*ts_5) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_6,char (*ts_7) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_8,char (*ts_9) [3])

{
  StringStream<4096UL,_4096UL> stream;
  undefined1 local_1128 [4344];
  
  local_1128._4120_8_ = local_1128 + 0x1030;
  local_1128._16_8_ = 0;
  local_1128._0_8_ = (char *)0x0;
  local_1128._8_8_ = 0;
  local_1128._4128_8_ = 0;
  local_1128._4136_8_ = 8;
  StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
  inner::
  join_helper<char_const(&)[7],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
            ((StringStream<4096UL,_4096UL> *)local_1128,(char (*) [7])this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts,
             (char (*) [2])ts_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_2,ts_3,
             (char (*) [4])ts_4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_5,
             (char (*) [2])ts_6,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_7,
             (char (*) [3])ts_8);
  StringStream<4096ul,4096ul>::str_abi_cxx11_(__return_storage_ptr__,local_1128);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}